

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O0

void usage(options_description *options)

{
  ostream *this;
  void *this_00;
  options_description *options_local;
  
  this = std::operator<<((ostream *)&std::cout,"usage: multi_serial_dump [options]");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  this_00 = (void *)boost::program_options::operator<<((ostream *)&std::cout,options);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"interface-defintion:\n");
  std::operator<<((ostream *)&std::cout,
                  "  <name>[:(<baudrate>,<bits><parity><stop-bits>|<baudrare>|<bits><parity><stop-bits>]\n"
                 );
  std::operator<<((ostream *)&std::cout,"  <name> : <device-name>[(<alias>)]\n");
  std::operator<<((ostream *)&std::cout,"\nexamples:\n");
  std::operator<<((ostream *)&std::cout,"  multi_serial_dump --interface com1:14404,8n1\n");
  std::operator<<((ostream *)&std::cout,"  multi_serial_dump -I /dev/cu.1233(com2):14404,7o1.5\n");
  std::operator<<((ostream *)&std::cout,"  multi_serial_dump -I com1 -I com2\n");
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void usage( const po::options_description& options )
{
    std::cout << "usage: multi_serial_dump [options]" << std::endl;
    std::cout << options << std::endl;

    std::cout << "interface-defintion:\n";
    std::cout << "  <name>[:(<baudrate>,<bits><parity><stop-bits>|<baudrare>|<bits><parity><stop-bits>]\n";
    std::cout << "  <name> : <device-name>[(<alias>)]\n";

    std::cout << "\nexamples:\n";
    std::cout << "  multi_serial_dump --interface com1:14404,8n1\n";
    std::cout << "  multi_serial_dump -I /dev/cu.1233(com2):14404,7o1.5\n";
    std::cout << "  multi_serial_dump -I com1 -I com2\n";

    std::cout << std::endl;
}